

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_wrapper_test.cpp
# Opt level: O0

int main(void)

{
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar1;
  bool bVar2;
  int iVar3;
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  ostream *poVar4;
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_278;
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *range_cursor;
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_250;
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *all_cursor;
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_228;
  Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *eq_cursor;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [8];
  string w;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [8];
  string v;
  string local_178 [39];
  allocator local_151;
  string local_150 [8];
  string u;
  undefined1 local_130 [8];
  string buf3;
  undefined1 local_108 [8];
  string buf2;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [8];
  string t;
  undefined1 local_98 [8];
  string buf;
  string local_70 [39];
  allocator local_49;
  string local_48 [8];
  string s;
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dict;
  
  this = (Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(0x80);
  FlatFile<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  FlatFile((FlatFile<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)this,0,key_type_numeric_signed,4,10,0x1e);
  printf("Insert %d [%s]\n",3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"hello!",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::string::string(local_70,local_48);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::insert(this,3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::__cxx11::string::~string(local_70);
  iVar3 = (int)this;
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get((Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_98,iVar3);
  poVar4 = std::operator<<((ostream *)&std::cout,"Retrieve key 3 and got back ");
  poVar4 = std::operator<<(poVar4,(string *)local_98);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Updating value of key 3 to hi!");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"hi!",&local_b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::string(local_e0,local_b8);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::update(this,3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  std::__cxx11::string::~string(local_e0);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get((Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_108,iVar3);
  poVar4 = std::operator<<((ostream *)&std::cout,"Retrieve key 3 after update and got back ");
  poVar4 = std::operator<<(poVar4,(string *)local_108);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Delete key 3");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::deleteRecord(this,3);
  poVar4 = std::operator<<((ostream *)&std::cout,"Try and retrieve key 3 after deletion");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get((Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_130,iVar3);
  poVar4 = std::operator<<((ostream *)&std::cout,"Retrieve key 3 and got back status ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)(this->last_status).error);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  printf("Insert %d [%s]\n",3,"test1!");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"test1!",&local_151);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::string(local_178,local_150);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::insert(this,3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
  std::__cxx11::string::~string(local_178);
  printf("Insert %d [%s]\n",3,"test2!");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"test2!",&local_1a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::string(local_1c8,local_1a0);
  Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::insert(this,3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
  std::__cxx11::string::~string(local_1c8);
  printf("Insert %d [%s]\n",4,"test3!");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"test3!",&local_1f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::__cxx11::string::string(local_218,local_1f0);
  eq_cursor = (Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::insert(this,4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_218);
  std::__cxx11::string::~string(local_218);
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing equality query on key 3: ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_228 = Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::equality(this,3);
  while( true ) {
    bVar2 = Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::next(local_228);
    if (!bVar2) break;
    poVar4 = std::operator<<((ostream *)&std::cout,"[eq] Got back [");
    iVar3 = Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::getKey(local_228);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,", ");
    Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue((Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&all_cursor);
    poVar4 = std::operator<<(poVar4,(string *)&all_cursor);
    poVar4 = std::operator<<(poVar4,"]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&all_cursor);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  pCVar1 = local_228;
  if (local_228 !=
      (Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Cursor(local_228);
    operator_delete(pCVar1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing all records query: ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_250 = Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allRecords(this);
  while( true ) {
    bVar2 = Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::next(local_250);
    if (!bVar2) break;
    poVar4 = std::operator<<((ostream *)&std::cout,"[all] Got back [");
    iVar3 = Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::getKey(local_250);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,", ");
    Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue((Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&range_cursor);
    poVar4 = std::operator<<(poVar4,(string *)&range_cursor);
    poVar4 = std::operator<<(poVar4,"]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&range_cursor);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  pCVar1 = local_250;
  if (local_250 !=
      (Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Cursor(local_250);
    operator_delete(pCVar1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing range query: 2<=key<=3 ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_278 = Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::range(this,2,3);
  while( true ) {
    bVar2 = Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::next(local_278);
    if (!bVar2) break;
    poVar4 = std::operator<<((ostream *)&std::cout,"[range] Got back [");
    iVar3 = Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::getKey(local_278);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,", ");
    Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue(&local_298);
    poVar4 = std::operator<<(poVar4,(string *)&local_298);
    poVar4 = std::operator<<(poVar4,"]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_298);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  pCVar1 = local_278;
  if (local_278 !=
      (Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    Cursor<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Cursor(local_278);
    operator_delete(pCVar1);
  }
  if (this != (Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
    Dictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Dictionary(this);
    operator_delete(this);
  }
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_48);
  return 0;
}

Assistant:

int
main(
) {
	/* The following is example test code using int keys and string values */
	Dictionary<int, string> *dict = new FlatFile<int, string>(0, key_type_numeric_signed, sizeof(int), 10, 30);

	printf("Insert %d [%s]\n", 3, "hello!");

	string s = "hello!";

	dict->insert(3, s);

	string buf = dict->get(3);

	cout << "Retrieve key 3 and got back " << buf << endl << endl;

	cout << "Updating value of key 3 to hi!" << endl;

	string t = "hi!";

	dict->update(3, t);

	string buf2 = dict->get(3);

	cout << "Retrieve key 3 after update and got back " << buf2 << endl << endl;

	cout << "Delete key 3" << endl;
	dict->deleteRecord(3);

	cout << "Try and retrieve key 3 after deletion" << endl;

	string buf3 = dict->get(3);

	cout << "Retrieve key 3 and got back status " << (int) dict->last_status.error << endl << endl;

	printf("Insert %d [%s]\n", 3, "test1!");

	string u = "test1!";

	dict->insert(3, u);

	printf("Insert %d [%s]\n", 3, "test2!");

	string v = "test2!";

	dict->insert(3, v);

	printf("Insert %d [%s]\n", 4, "test3!");

	string w = "test3!";

	dict->insert(4, w);

	cout << "Testing equality query on key 3: " << endl;
	Cursor<int, string> *eq_cursor = dict->equality(3);

	while (eq_cursor->next()) {
		cout << "[eq] Got back [" << eq_cursor->getKey() << ", " << eq_cursor->getValue() << "]" << endl;
	}

	cout << endl;

	delete eq_cursor;

	cout << "Testing all records query: " << endl;
	Cursor<int, string> *all_cursor = dict->allRecords();

	while (all_cursor->next()) {
		cout << "[all] Got back [" << all_cursor->getKey() << ", " << all_cursor->getValue() << "]" << endl;
	}

	cout << endl;

	delete all_cursor;

	cout << "Testing range query: 2<=key<=3 " << endl;
	Cursor<int, string> *range_cursor = dict->range(2, 3);

	while (range_cursor->next()) {
		cout << "[range] Got back [" << range_cursor->getKey() << ", " << range_cursor->getValue() << "]" << endl;
	}

	cout << endl;

	delete range_cursor;

	delete dict;
}